

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelTypeCase::getComponentType
          (TextureLevelTypeCase *this,GLenum internalFormat)

{
  TextureChannelClass TVar1;
  TextureFormat TVar2;
  int local_2c;
  GLenum channelType;
  TextureChannelClass channelClass;
  TextureFormat format;
  GLenum internalFormat_local;
  TextureLevelTypeCase *this_local;
  
  TVar2 = glu::mapGLInternalFormat(internalFormat);
  channelClass = TVar2.type;
  TVar1 = tcu::getTextureChannelClass(channelClass);
  local_2c = 0;
  if (channelClass == 0x19) {
    if (this->m_pname == 0x8c16) {
      this_local._4_4_ = 0x8c17;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (channelClass == 0x25) {
    if (this->m_pname == 0x8c16) {
      this_local._4_4_ = 0x1406;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    switch(TVar1) {
    case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      local_2c = 0x8f9c;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      local_2c = 0x8c17;
      break;
    case TEXTURECHANNELCLASS_SIGNED_INTEGER:
      local_2c = 0x1404;
      break;
    case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
      local_2c = 0x1405;
      break;
    case TEXTURECHANNELCLASS_FLOATING_POINT:
      local_2c = 0x1406;
    }
    channelType = TVar2.order;
    switch(this->m_pname) {
    case 0x8c10:
      if (((channelType == 0) || (channelType == 5)) ||
         (((channelType == 7 || (((channelType == 8 || (channelType == 0xb)) || (channelType == 9)))
           ) || ((channelType == 0xe || (channelType == 0xf)))))) {
        this_local._4_4_ = local_2c;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0x8c11:
      if (((((channelType == 5) || (channelType == 7)) || (channelType == 8)) ||
          ((channelType == 0xb || (channelType == 9)))) ||
         ((channelType == 0xe || (channelType == 0xf)))) {
        this_local._4_4_ = local_2c;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0x8c12:
      if ((((channelType == 7) || (channelType == 8)) ||
          ((channelType == 0xb || ((channelType == 9 || (channelType == 0xe)))))) ||
         (channelType == 0xf)) {
        this_local._4_4_ = local_2c;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0x8c13:
      if ((((channelType == 8) || (channelType == 0xb)) || (channelType == 9)) ||
         (channelType == 0xf)) {
        this_local._4_4_ = local_2c;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    default:
      this_local._4_4_ = 0;
      break;
    case 0x8c16:
      if ((channelType == 0x12) || (channelType == 0x14)) {
        this_local._4_4_ = local_2c;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int TextureLevelTypeCase::getComponentType (glw::GLenum internalFormat)
{
	const tcu::TextureFormat		format			= glu::mapGLInternalFormat(internalFormat);
	const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);
	glw::GLenum						channelType		= GL_NONE;

	// depth-stencil special cases
	if (format.type == tcu::TextureFormat::UNSIGNED_INT_24_8)
	{
		if (m_pname == GL_TEXTURE_DEPTH_TYPE)
			return GL_UNSIGNED_NORMALIZED;
		else
			return GL_NONE;
	}
	else if (format.type == tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV)
	{
		if (m_pname == GL_TEXTURE_DEPTH_TYPE)
			return GL_FLOAT;
		else
			return GL_NONE;
	}
	else
	{
		switch (channelClass)
		{
			case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:		channelType = GL_SIGNED_NORMALIZED;		break;
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:		channelType = GL_UNSIGNED_NORMALIZED;	break;
			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:			channelType = GL_INT;					break;
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:			channelType = GL_UNSIGNED_INT;			break;
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:			channelType = GL_FLOAT;					break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	switch (m_pname)
	{
		case GL_TEXTURE_RED_TYPE:
			if (format.order == tcu::TextureFormat::R		||
				format.order == tcu::TextureFormat::RG		||
				format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelType;
			else
				return GL_NONE;

		case GL_TEXTURE_GREEN_TYPE:
			if (format.order == tcu::TextureFormat::RG		||
				format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelType;
			else
				return GL_NONE;

		case GL_TEXTURE_BLUE_TYPE:
			if (format.order == tcu::TextureFormat::RGB		||
				format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelType;
			else
				return GL_NONE;

		case GL_TEXTURE_ALPHA_TYPE:
			if (format.order == tcu::TextureFormat::RGBA	||
				format.order == tcu::TextureFormat::BGRA	||
				format.order == tcu::TextureFormat::ARGB	||
				format.order == tcu::TextureFormat::sRGBA)
				return channelType;
			else
				return GL_NONE;

		case GL_TEXTURE_DEPTH_TYPE:
			if (format.order == tcu::TextureFormat::D	||
				format.order == tcu::TextureFormat::DS)
				return channelType;
			else
				return GL_NONE;

		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}